

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_NMTOKENS(void)

{
  char *pcVar1;
  char cVar2;
  XSValue *pXVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  void *pvVar7;
  Status SVar8;
  int iVar9;
  Status myStatus;
  StrX local_a0;
  char iv_3 [5];
  char iv_2 [5];
  char iv_1 [7];
  char v_3 [12];
  char v_1 [19];
  char v_2 [24];
  int iVar10;
  
  builtin_strncpy(v_1,"name1 name2 name3 ",0x13);
  builtin_strncpy(v_2,"Zeerochert total number",0x18);
  builtin_strncpy(v_3,"007 009 123",0xc);
  builtin_strncpy(iv_1,"#board",7);
  builtin_strncpy(iv_2,"@com",5);
  builtin_strncpy(iv_3,";abc",5);
  myStatus = st_Init;
  StrX::StrX(&local_a0,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169c,v_1,local_a0.fLocalForm,1);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169d,v_2,local_a0.fLocalForm,1);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169e,v_3,local_a0.fLocalForm,1);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar2 != '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a1,iv_1,local_a0.fLocalForm,0);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar2 != '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a2,iv_2,local_a0.fLocalForm,0);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar2 != '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a3,iv_3,local_a0.fLocalForm,0);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  iVar10 = 2;
  while (iVar9 = iVar10 + -1, iVar10 != 0) {
    myStatus = st_Init;
    StrX::StrX(&local_a0,v_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar1 = local_a0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16bd,v_1,pcVar1,"st_NoActVal",pcVar4);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar7 = (void *)0x16bd;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16bd,v_1);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_a0,v_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar1 = local_a0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16be,v_2,pcVar1,"st_NoActVal",pcVar4);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar7 = (void *)0x16be;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16be,v_2);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_a0,v_3);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar1 = local_a0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16bf,v_3,pcVar1,"st_NoActVal",pcVar4);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar7 = (void *)0x16bf;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16bf,v_3);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_a0,iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar3 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar10 == 2) * 3 + st_NoActVal;
      if (SVar8 != myStatus) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar1 = local_a0.fLocalForm;
        pcVar4 = getStatusString(SVar8);
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16c3,iv_1,pcVar1,pcVar4,pcVar5);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar7 = (void *)0x16c3;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c3,iv_1);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_a0,iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar3 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar10 == 2) * 3 + st_NoActVal;
      if (SVar8 != myStatus) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar1 = local_a0.fLocalForm;
        pcVar4 = getStatusString(SVar8);
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16c5,iv_2,pcVar1,pcVar4,pcVar5);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar7 = (void *)0x16c5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c5,iv_2);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_a0,iv_3);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar3 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar10 == 2) * 3 + st_NoActVal;
      iVar10 = iVar9;
      if (SVar8 != myStatus) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar1 = local_a0.fLocalForm;
        pcVar4 = getStatusString(SVar8);
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16c7,iv_3,pcVar1,pcVar4,pcVar5);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar7 = (void *)0x16c7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c7,iv_3);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
      iVar10 = iVar9;
    }
  }
  iVar10 = 2;
LAB_0012edf4:
  iVar9 = iVar10 + -1;
  if (iVar10 == 0) {
    return;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,v_1);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (lVar6 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pcVar1 = local_a0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x16e4,v_1,pcVar1,"st_NoCanRep",pcVar4);
      StrX::~StrX(&local_a0);
      goto LAB_0012eed9;
    }
  }
  else {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x16e4,v_1);
    StrX::~StrX(&local_a0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012eed9:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,v_2);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (lVar6 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pcVar1 = local_a0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x16e5,v_2,pcVar1,"st_NoCanRep",pcVar4);
      StrX::~StrX(&local_a0);
      goto LAB_0012efbb;
    }
  }
  else {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x16e5,v_2);
    StrX::~StrX(&local_a0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012efbb:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,v_3);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (lVar6 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pcVar1 = local_a0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x16e6,v_3,pcVar1,"st_NoCanRep",pcVar4);
      StrX::~StrX(&local_a0);
      goto LAB_0012f09d;
    }
  }
  else {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x16e6,v_3);
    StrX::~StrX(&local_a0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012f09d:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,iv_1);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (lVar6 == 0) {
    SVar8 = (uint)(iVar10 == 2) * 4 + st_NoCanRep;
    if (SVar8 != myStatus) {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pcVar1 = local_a0.fLocalForm;
      pcVar4 = getStatusString(SVar8);
      pcVar5 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x16ea,iv_1,pcVar1,pcVar4,pcVar5);
      StrX::~StrX(&local_a0);
      goto LAB_0012f196;
    }
  }
  else {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x16ea,iv_1);
    StrX::~StrX(&local_a0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012f196:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,iv_2);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (lVar6 == 0) {
    SVar8 = (uint)(iVar10 == 2) * 4 + st_NoCanRep;
    if (SVar8 != myStatus) {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pcVar1 = local_a0.fLocalForm;
      pcVar4 = getStatusString(SVar8);
      pcVar5 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x16ec,iv_2,pcVar1,pcVar4,pcVar5);
      StrX::~StrX(&local_a0);
      goto LAB_0012f28f;
    }
  }
  else {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x16ec,iv_2);
    StrX::~StrX(&local_a0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012f28f:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_a0,iv_3);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (lVar6 == 0) goto LAB_0012f320;
  StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x16ee,iv_3);
  StrX::~StrX(&local_a0);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
  goto LAB_0012f388;
LAB_0012f320:
  SVar8 = (uint)(iVar10 == 2) * 4 + st_NoCanRep;
  iVar10 = iVar9;
  if (SVar8 != myStatus) {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    pcVar1 = local_a0.fLocalForm;
    pcVar4 = getStatusString(SVar8);
    pcVar5 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x16ee,iv_3,pcVar1,pcVar4,pcVar5);
    StrX::~StrX(&local_a0);
LAB_0012f388:
    errSeen = 1;
    iVar10 = iVar9;
  }
  goto LAB_0012edf4;
}

Assistant:

void test_dt_NMTOKENS()
{
    const XSValue::DataType dt = XSValue::dt_NMTOKENS;
    bool  toValidate = true;

    const char v_1[]="name1 name2 name3 ";
    const char v_2[]="Zeerochert total number";
    const char v_3[]="007 009 123";

    const char iv_1[]="#board";
    const char iv_2[]="@com";
    const char iv_3[]=";abc";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}